

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# barcode.h
# Opt level: O0

void __thiscall
barcode_output_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>
::barcode_output_t(barcode_output_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>
                   *this,flagser_parameters *params)

{
  undefined2 *in_RSI;
  undefined8 *in_RDI;
  string *in_stack_00000248;
  file_output_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>
  *in_stack_00000250;
  string local_30 [32];
  undefined2 *local_10;
  
  local_10 = in_RSI;
  std::__cxx11::string::string(local_30,(string *)(in_RSI + 0x20));
  file_output_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>
  ::file_output_t(in_stack_00000250,in_stack_00000248);
  std::__cxx11::string::~string(local_30);
  *in_RDI = &PTR__barcode_output_t_002028e8;
  *(undefined2 *)(in_RDI + 0x42) = 0;
  *(undefined2 *)((long)in_RDI + 0x212) = local_10[1];
  *(undefined2 *)((long)in_RDI + 0x214) = *local_10;
  *(undefined2 *)((long)in_RDI + 0x216) = local_10[2];
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1b76b2);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1b76c3);
  *(undefined4 *)(in_RDI + 0x49) = 0;
  return;
}

Assistant:

barcode_output_t(const flagser_parameters& params)
	    : file_output_t<Complex>(params.output_name), min_dimension(params.min_dimension),
	      max_dimension(params.max_dimension), modulus(params.modulus) {}